

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

void __thiscall
flatbuffers::go::GoGenerator::MutateScalarFieldOfStruct
          (GoGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  allocator<char> local_201;
  string local_200;
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_90;
  string local_70;
  undefined1 local_50 [8];
  string setter;
  string *code;
  string *code_ptr_local;
  FieldDef *field_local;
  StructDef *struct_def_local;
  GoGenerator *this_local;
  
  setter.field_2._8_8_ = code_ptr;
  GenTypeBasic_abi_cxx11_(&local_90,this,&(field->value).type);
  Namer::Method(&local_70,&(this->namer_).super_Namer,&local_90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 "rcv._tab.Mutate",&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  GenReceiver(this,struct_def,code_ptr);
  IdlNamer::Function_abi_cxx11_(&local_e0,&this->namer_,&field->super_Definition);
  std::operator+(&local_c0," Mutate",&local_e0);
  std::__cxx11::string::operator+=((string *)setter.field_2._8_8_,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  GenTypeGet_abi_cxx11_(&local_160,this,&(field->value).type);
  std::operator+(&local_140,"(n ",&local_160);
  std::operator+(&local_120,&local_140,") bool {\n\treturn ");
  std::operator+(&local_100,&local_120,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  std::__cxx11::string::operator+=((string *)setter.field_2._8_8_,(string *)&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::operator+=
            ((string *)setter.field_2._8_8_,"(rcv._tab.Pos+flatbuffers.UOffsetT(");
  NumToString<unsigned_short>(&local_1a0,(field->value).offset);
  std::operator+(&local_180,&local_1a0,"), ");
  std::__cxx11::string::operator+=((string *)setter.field_2._8_8_,(string *)&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"n",&local_201);
  CastToBaseType(&local_1e0,this,&(field->value).type,&local_200);
  std::operator+(&local_1c0,&local_1e0,")\n}\n\n");
  std::__cxx11::string::operator+=((string *)setter.field_2._8_8_,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void MutateScalarFieldOfStruct(const StructDef &struct_def,
                                 const FieldDef &field, std::string *code_ptr) {
    std::string &code = *code_ptr;
    std::string setter =
        "rcv._tab.Mutate" + namer_.Method(GenTypeBasic(field.value.type));
    GenReceiver(struct_def, code_ptr);
    code += " Mutate" + namer_.Function(field);
    code +=
        "(n " + GenTypeGet(field.value.type) + ") bool {\n\treturn " + setter;
    code += "(rcv._tab.Pos+flatbuffers.UOffsetT(";
    code += NumToString(field.value.offset) + "), ";
    code += CastToBaseType(field.value.type, "n") + ")\n}\n\n";
  }